

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setprop.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *__ptr;
  size_t sStack_10;
  
  if (argc == 3) {
    iVar1 = property_set(argv[1],argv[2]);
    if (iVar1 == 0) {
      return 0;
    }
    __ptr = "could not set property\n";
    sStack_10 = 0x17;
  }
  else {
    __ptr = "usage: setprop <key> <value>\n";
    sStack_10 = 0x1d;
  }
  fwrite(__ptr,sStack_10,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    if(argc != 3) {
        fprintf(stderr,"usage: setprop <key> <value>\n");
        return 1;
    }

    if(property_set(argv[1], argv[2])){
        fprintf(stderr,"could not set property\n");
        return 1;
    }

    return 0;
}